

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

void __thiscall cppnet::RWSocket::OnConnect(RWSocket *this,uint16_t err)

{
  uint64_t *__k;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  __shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined6 in_register_00000032;
  long *in_FS_OFFSET;
  shared_ptr<cppnet::RWSocket> sock;
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  __shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  __connecting_socket_map::__tls_init();
  __k = &(this->super_Socket)._sock;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(*in_FS_OFFSET + -0x80),__k);
  LOCK();
  (this->_connecting)._M_base._M_i = false;
  UNLOCK();
  std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::RWSocket,void>
            ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<cppnet::RWSocket>);
  if ((int)CONCAT62(in_register_00000032,err) == 0) {
    this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)Socket::__all_socket_map();
    this_01 = (__shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *)
              std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_00,__k);
    std::__shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2>::operator=(this_01,&local_50);
  }
  std::__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&(this->super_Socket)._cppnet_base);
  if (local_30._M_ptr != (CppNetBase *)0x0) {
    std::__shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&local_50);
    CppNetBase::OnConnect(local_30._M_ptr,(shared_ptr<cppnet::RWSocket> *)&local_40,err);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  if (err == 0) {
    (*(this->super_Socket)._vptr_Socket[7])(this);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void RWSocket::OnConnect(uint16_t err) {
    __connecting_socket_map.erase(_sock);
    _connecting = false;
    auto sock = shared_from_this();
    if (err == CEC_SUCCESS) {
        __all_socket_map[_sock] = sock;
    }
    
    auto cppnet_base = _cppnet_base.lock();
    if (cppnet_base) {
        cppnet_base->OnConnect(sock, err);
    }

    if (err == CEC_SUCCESS) {
        Read();
    }
}